

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfilesystementry.cpp
# Opt level: O2

void __thiscall QFileSystemEntry::resolveFilePath(QFileSystemEntry *this)

{
  qsizetype qVar1;
  Data *pDVar2;
  char16_t *pcVar3;
  long in_FS_OFFSET;
  QArrayDataPointer<char16_t> local_50;
  QArrayDataPointer<char16_t> local_38;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  if (((this->m_filePath).d.size == 0) && ((this->m_nativeFilePath).d.size != 0)) {
    QString::fromLocal8Bit<void>((QString *)&local_50,&this->m_nativeFilePath);
    QDir::fromNativeSeparators((QString *)&local_38,(QString *)&local_50);
    pDVar2 = (this->m_filePath).d.d;
    pcVar3 = (this->m_filePath).d.ptr;
    (this->m_filePath).d.d = local_38.d;
    (this->m_filePath).d.ptr = local_38.ptr;
    qVar1 = (this->m_filePath).d.size;
    (this->m_filePath).d.size = local_38.size;
    local_38.d = pDVar2;
    local_38.ptr = pcVar3;
    local_38.size = qVar1;
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_38);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_50);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QFileSystemEntry::resolveFilePath() const
{
    if (m_filePath.isEmpty() && !m_nativeFilePath.isEmpty()) {
#ifdef Q_OS_WIN
        m_filePath = QDir::fromNativeSeparators(m_nativeFilePath);
#else
        m_filePath = QDir::fromNativeSeparators(QFile::decodeName(m_nativeFilePath));
#endif
    }
}